

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_aad_x86_64(CPUX86State *env,int base)

{
  uint uVar1;
  int ah;
  int al;
  int base_local;
  CPUX86State *env_local;
  
  uVar1 = ((uint)(env->regs[0] >> 8) & 0xff) * base + ((uint)env->regs[0] & 0xff) & 0xff;
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | (long)(int)uVar1;
  env->cc_dst = (long)(int)uVar1;
  return;
}

Assistant:

void helper_aad(CPUX86State *env, int base)
{
    int al, ah;

    al = env->regs[R_EAX] & 0xff;
    ah = (env->regs[R_EAX] >> 8) & 0xff;
    al = ((ah * base) + al) & 0xff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al;
    CC_DST = al;
}